

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O1

bool stick::URI::isUnreservedChar(char _c)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = true;
  if ((((9 < (byte)(_c - 0x30U)) && (0x19 < (byte)((_c & 0xdfU) + 0xbf))) &&
      (iVar2 = (int)_c, 1 < iVar2 - 0x2dU)) && ((iVar2 != 0x5f && (iVar2 != 0x7e)))) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool URI::isUnreservedChar(char _c)
{
    // see 2.3.  Unreserved Characters
    if ((_c >= 'a' && _c <= 'z') || (_c >= 'A' && _c <= 'Z') || (_c >= '0' && _c <= '9') ||
        _c == '-' || _c == '_' || _c == '.' || _c == '~')
        return true;
    else
        return false;
}